

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_absorb(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  AFFECT_DATA af;
  AFFECT_DATA AStack_98;
  
  bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_absorb);
  if (bVar1) {
    send_to_char("You are already absorbing electricity.\n\r",ch);
    return;
  }
  init_affect(&AStack_98);
  AStack_98.where = 0;
  AStack_98.aftype = 0;
  AStack_98.type = gsn_absorb;
  AStack_98.level = (short)level;
  iVar2 = dice(4,2);
  uVar3 = level + 3;
  if (-1 < level) {
    uVar3 = level;
  }
  AStack_98.duration = (short)(uVar3 >> 2) + (short)iVar2;
  AStack_98.location = 0;
  AStack_98.modifier = 0;
  affect_to_char((CHAR_DATA *)vo,&AStack_98);
  send_to_char("Warmth fills your body as you attune yourself to channel raw lightning.\n\r",
               (CHAR_DATA *)vo);
  act("Flashes of light illuminate $N\'s eyes for a moment as $E completes the spell.",ch,
      (void *)0x0,vo,0);
  return;
}

Assistant:

void spell_absorb(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, gsn_absorb))
	{
		send_to_char("You are already absorbing electricity.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_absorb;
	af.level = level;
	af.duration = dice(4, 2) + level / 4;
	af.modifier = 0;
	af.location = 0;
	affect_to_char(victim, &af);

	send_to_char("Warmth fills your body as you attune yourself to channel raw lightning.\n\r", victim);
	act("Flashes of light illuminate $N's eyes for a moment as $E completes the spell.", ch, nullptr, victim, TO_ROOM);
}